

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_surface.cpp
# Opt level: O0

Reals __thiscall
Omega_h::get_curv_vert_curvatures_dim<2>
          (Omega_h *this,Mesh *mesh,LOs *curv_edge2edge,Reals *curv_edge_curvatures,
          LOs *curv_vert2vert)

{
  LO LVar1;
  void *extraout_RDX;
  Reals RVar2;
  Read<int> local_268;
  Read<double> local_258;
  Write<double> local_248;
  undefined1 local_238 [8];
  Reals curv_vert_curvatures;
  type f;
  string local_180 [32];
  undefined1 local_160 [8];
  Write<double> curv_vert_curvatures_w;
  Reals coords;
  undefined1 local_130 [8];
  Read<signed_char> edges_touch_bdry;
  allocator local_109;
  string local_108 [32];
  Read<signed_char> local_e8;
  undefined1 local_d8 [8];
  Read<signed_char> verts_not_curv;
  undefined1 local_c0 [4];
  LO ncurv_verts;
  undefined1 local_b0 [8];
  LOs edge2curv_edge;
  undefined1 local_90 [8];
  LOs edges2verts;
  Adj verts2edges;
  LOs *curv_vert2vert_local;
  Reals *curv_edge_curvatures_local;
  LOs *curv_edge2edge_local;
  Mesh *mesh_local;
  pointer local_10;
  
  Mesh::ask_up((Adj *)&edges2verts.write_.shared_alloc_.direct_ptr,mesh,0,1);
  Mesh::ask_verts_of((Mesh *)local_90,(Int)mesh);
  Read<int>::Read((Read<int> *)local_c0,curv_edge2edge);
  LVar1 = Mesh::nedges(mesh);
  invert_injective_map((Omega_h *)local_b0,(LOs *)local_c0,LVar1);
  Read<int>::~Read((Read<int> *)local_c0);
  if (((ulong)(curv_vert2vert->write_).shared_alloc_.alloc & 1) == 0) {
    local_10 = (pointer)((curv_vert2vert->write_).shared_alloc_.alloc)->size;
  }
  else {
    local_10 = (pointer)((ulong)(curv_vert2vert->write_).shared_alloc_.alloc >> 3);
  }
  LVar1 = (LO)((ulong)local_10 >> 2);
  verts_not_curv.write_.shared_alloc_.direct_ptr._4_4_ = LVar1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_108,"",&local_109);
  Read<signed_char>::Read(&local_e8,LVar1,'\0',(string *)local_108);
  Read<int>::Read((Read<int> *)&edges_touch_bdry.write_.shared_alloc_.direct_ptr,curv_vert2vert);
  LVar1 = Mesh::nverts(mesh);
  map_onto<signed_char>
            ((Omega_h *)local_d8,&local_e8,(LOs *)&edges_touch_bdry.write_.shared_alloc_.direct_ptr,
             LVar1,'\x01',1);
  Read<int>::~Read((Read<int> *)&edges_touch_bdry.write_.shared_alloc_.direct_ptr);
  Read<signed_char>::~Read(&local_e8);
  std::__cxx11::string::~string(local_108);
  std::allocator<char>::~allocator((allocator<char> *)&local_109);
  Read<signed_char>::Read
            ((Read<signed_char> *)&coords.write_.shared_alloc_.direct_ptr,
             (Read<signed_char> *)local_d8);
  mark_up((Omega_h *)local_130,mesh,0,1,(Read<signed_char> *)&coords.write_.shared_alloc_.direct_ptr
         );
  Read<signed_char>::~Read((Read<signed_char> *)&coords.write_.shared_alloc_.direct_ptr);
  Mesh::coords((Mesh *)&curv_vert_curvatures_w.shared_alloc_.direct_ptr);
  LVar1 = verts_not_curv.write_.shared_alloc_.direct_ptr._4_4_;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_180,"",
             (allocator *)((long)&f.curv_vert_curvatures_w.shared_alloc_.direct_ptr + 7));
  Write<double>::Write((Write<double> *)local_160,LVar1,(string *)local_180);
  std::__cxx11::string::~string(local_180);
  std::allocator<char>::~allocator
            ((allocator<char> *)((long)&f.curv_vert_curvatures_w.shared_alloc_.direct_ptr + 7));
  Read<int>::Read((Read<int> *)&curv_vert_curvatures.write_.shared_alloc_.direct_ptr,curv_vert2vert)
  ;
  Adj::Adj((Adj *)&f.curv_vert2vert.write_.shared_alloc_.direct_ptr,
           (Adj *)&edges2verts.write_.shared_alloc_.direct_ptr);
  Read<signed_char>::Read
            ((Read<signed_char> *)&f.verts2edges.codes.write_.shared_alloc_.direct_ptr,
             (Read<signed_char> *)local_130);
  Read<int>::Read((Read<int> *)&f.edges_touch_bdry.write_.shared_alloc_.direct_ptr,
                  (Read<int> *)local_b0);
  Read<int>::Read((Read<int> *)&f.edge2curv_edge.write_.shared_alloc_.direct_ptr,
                  (Read<int> *)local_90);
  Read<double>::Read((Read<double> *)&f.edges2verts.write_.shared_alloc_.direct_ptr,
                     (Read<double> *)&curv_vert_curvatures_w.shared_alloc_.direct_ptr);
  Read<double>::Read((Read<double> *)&f.coords.write_.shared_alloc_.direct_ptr,curv_edge_curvatures)
  ;
  Write<double>::Write
            ((Write<double> *)&f.curv_edge_curvatures.write_.shared_alloc_.direct_ptr,
             (Write<double> *)local_160);
  parallel_for<Omega_h::get_curv_vert_curvatures_dim<2>(Omega_h::Mesh*,Omega_h::Read<int>,Omega_h::Read<double>,Omega_h::Read<int>)::_lambda(int)_1_>
            (verts_not_curv.write_.shared_alloc_.direct_ptr._4_4_,
             (type *)&curv_vert_curvatures.write_.shared_alloc_.direct_ptr,
             "get_curv_vert_curvatures");
  Write<double>::Write(&local_248,(Write<double> *)local_160);
  Read<double>::Read((Read<double> *)local_238,&local_248);
  Write<double>::~Write(&local_248);
  Read<double>::Read(&local_258,(Read<double> *)local_238);
  Read<int>::Read(&local_268,curv_vert2vert);
  Mesh::sync_subset_array<double>
            ((Mesh *)this,(Int)mesh,(Read<double> *)0x0,(LOs *)&local_258,0.0,(Int)&local_268);
  Read<int>::~Read(&local_268);
  Read<double>::~Read(&local_258);
  Read<double>::~Read((Read<double> *)local_238);
  get_curv_vert_curvatures_dim<2>(Omega_h::Mesh*,Omega_h::Read<int>,Omega_h::Read<double>,Omega_h::Read<int>)
  ::{lambda(int)#1}::~Mesh((_lambda_int__1_ *)&curv_vert_curvatures.write_.shared_alloc_.direct_ptr)
  ;
  Write<double>::~Write((Write<double> *)local_160);
  Read<double>::~Read((Read<double> *)&curv_vert_curvatures_w.shared_alloc_.direct_ptr);
  Read<signed_char>::~Read((Read<signed_char> *)local_130);
  Read<signed_char>::~Read((Read<signed_char> *)local_d8);
  Read<int>::~Read((Read<int> *)local_b0);
  Read<int>::~Read((Read<int> *)local_90);
  Adj::~Adj((Adj *)&edges2verts.write_.shared_alloc_.direct_ptr);
  RVar2.write_.shared_alloc_.direct_ptr = extraout_RDX;
  RVar2.write_.shared_alloc_.alloc = (Alloc *)this;
  return (Reals)RVar2.write_.shared_alloc_;
}

Assistant:

Reals get_curv_vert_curvatures_dim(Mesh* mesh, LOs curv_edge2edge,
    Reals curv_edge_curvatures, LOs curv_vert2vert) {
  auto verts2edges = mesh->ask_up(VERT, EDGE);
  auto edges2verts = mesh->ask_verts_of(EDGE);
  auto edge2curv_edge = invert_injective_map(curv_edge2edge, mesh->nedges());
  auto ncurv_verts = curv_vert2vert.size();
  auto verts_not_curv = map_onto(
      Read<I8>(ncurv_verts, I8(0)), curv_vert2vert, mesh->nverts(), I8(1), 1);
  auto edges_touch_bdry = mark_up(mesh, VERT, EDGE, verts_not_curv);
  auto coords = mesh->coords();
  auto curv_vert_curvatures_w = Write<Real>(ncurv_verts);
  auto f = OMEGA_H_LAMBDA(LO curv_vert) {
    auto vert = curv_vert2vert[curv_vert];
    Int nadj_int_edges = 0;
    for (auto ve = verts2edges.a2ab[vert]; ve < verts2edges.a2ab[vert + 1];
         ++ve) {
      auto edge = verts2edges.ab2b[ve];
      nadj_int_edges += !edges_touch_bdry[edge];
    }
    Real ws = 0.0;
    Real curvature = 0.0;
    for (auto ve = verts2edges.a2ab[vert]; ve < verts2edges.a2ab[vert + 1];
         ++ve) {
      auto edge = verts2edges.ab2b[ve];
      auto curv_edge = edge2curv_edge[edge];
      if (curv_edge < 0) continue;
      if (nadj_int_edges && edges_touch_bdry[edge]) continue;
      auto eev2v = gather_verts<2>(edges2verts, edge);
      auto p = gather_vectors<2, dim>(coords, eev2v);
      auto l = norm(p[1] - p[0]);
      auto ec = curv_edge_curvatures[curv_edge];
      curvature += ec * l;
      ws += l;
    }
    curvature /= ws;
    curv_vert_curvatures_w[curv_vert] = curvature;
  };
  parallel_for(ncurv_verts, f, "get_curv_vert_curvatures");
  auto curv_vert_curvatures = Reals(curv_vert_curvatures_w);
  return mesh->sync_subset_array(
      VERT, curv_vert_curvatures, curv_vert2vert, 0.0, 1);
}